

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoder_utils.c
# Opt level: O1

void av1_set_mb_ssim_rdmult_scaling(AV1_COMP *cpi)

{
  int iVar1;
  int iVar2;
  uint8_t *puVar3;
  double *pdVar4;
  bool bVar5;
  uint uVar6;
  int iVar7;
  ulong uVar8;
  uint uVar9;
  int iVar11;
  ulong uVar13;
  long lVar14;
  int iVar15;
  uint uVar16;
  ulong uVar17;
  uint8_t *puVar18;
  ulong uVar19;
  int mi_row;
  ulong uVar20;
  double dVar21;
  double dVar22;
  buf_2d buf;
  ulong local_108;
  double local_100;
  ulong local_d8;
  ulong local_d0;
  buf_2d local_50;
  int iVar10;
  ulong uVar12;
  
  iVar1 = (cpi->common).mi_params.mi_rows;
  iVar2 = (cpi->common).mi_params.mi_cols;
  iVar10 = iVar2 + 6;
  if (-1 < iVar2 + 3) {
    iVar10 = iVar2 + 3;
  }
  uVar9 = iVar10 >> 2;
  uVar12 = (ulong)uVar9;
  iVar10 = iVar1 + 6;
  if (-1 < iVar1 + 3) {
    iVar10 = iVar1 + 3;
  }
  uVar16 = iVar10 >> 2;
  if (iVar1 < 1) {
    dVar22 = 0.0;
  }
  else {
    puVar3 = (cpi->source->field_5).buffers[0];
    iVar10 = (cpi->source->field_4).field_0.y_stride;
    uVar17 = 1;
    if (1 < (int)uVar9) {
      uVar17 = (ulong)uVar9;
    }
    uVar8 = 1;
    if (1 < (int)uVar16) {
      uVar8 = (ulong)uVar16;
    }
    dVar22 = 0.0;
    iVar7 = 0;
    uVar13 = 0;
    local_d8 = 0;
    do {
      if (0 < iVar2) {
        iVar15 = 0;
        local_d0 = 2;
        local_108 = 0;
        do {
          dVar21 = NAN;
          if ((long)(uVar13 * 4) < (long)(cpi->common).mi_params.mi_rows) {
            dVar21 = 0.0;
            local_100 = 0.0;
            uVar20 = local_d8;
            iVar11 = iVar7;
            do {
              if ((long)(local_108 * 4) < (long)(cpi->common).mi_params.mi_cols) {
                puVar18 = puVar3 + (long)iVar11 + (long)iVar15;
                uVar19 = local_d0;
                do {
                  local_50.buf = puVar18;
                  local_50.stride = iVar10;
                  uVar6 = av1_get_perpixel_variance_facade
                                    (cpi,&(cpi->td).mb.e_mbd,&local_50,BLOCK_8X8,0);
                  dVar21 = (double)uVar6 + dVar21;
                  local_100 = local_100 + 1.0;
                  if (local_108 * 4 + 4 <= uVar19) break;
                  puVar18 = puVar18 + 8;
                  bVar5 = (long)uVar19 < (long)(cpi->common).mi_params.mi_cols;
                  uVar19 = uVar19 + 2;
                } while (bVar5);
              }
              uVar20 = uVar20 + 2;
            } while ((uVar20 < uVar13 * 4 + 4) &&
                    (iVar11 = iVar11 + iVar10 * 8,
                    (long)uVar20 < (long)(cpi->common).mi_params.mi_rows));
            dVar21 = (dVar21 / local_100) * -0.0021489;
          }
          dVar21 = exp(dVar21);
          dVar21 = (1.0 - dVar21) * 67.035434 + 17.492222;
          cpi->ssim_rdmult_scaling_factors[local_108 + uVar13 * uVar12] = dVar21;
          dVar21 = log(dVar21);
          dVar22 = dVar22 + dVar21;
          local_108 = local_108 + 1;
          iVar15 = iVar15 + 0x10;
          local_d0 = local_d0 + 4;
        } while (local_108 != uVar17);
      }
      uVar13 = uVar13 + 1;
      local_d8 = local_d8 + 4;
      iVar7 = iVar7 + iVar10 * 0x10;
    } while (uVar13 != uVar8);
  }
  dVar22 = exp(dVar22 / (double)(int)(uVar16 * uVar9));
  if (0 < iVar1) {
    uVar17 = uVar12;
    if ((int)uVar9 < 2) {
      uVar17 = 1;
    }
    uVar9 = 1;
    if (1 < (int)uVar16) {
      uVar9 = uVar16;
    }
    lVar14 = 0;
    uVar8 = 0;
    do {
      if (0 < iVar2) {
        pdVar4 = cpi->ssim_rdmult_scaling_factors;
        uVar13 = 0;
        do {
          *(double *)((long)pdVar4 + uVar13 * 8 + lVar14) =
               *(double *)((long)pdVar4 + uVar13 * 8 + lVar14) / dVar22;
          uVar13 = uVar13 + 1;
        } while (uVar17 != uVar13);
      }
      uVar8 = uVar8 + 1;
      lVar14 = lVar14 + uVar12 * 8;
    } while (uVar8 != uVar9);
  }
  return;
}

Assistant:

void av1_set_mb_ssim_rdmult_scaling(AV1_COMP *cpi) {
  const CommonModeInfoParams *const mi_params = &cpi->common.mi_params;
  const MACROBLOCKD *const xd = &cpi->td.mb.e_mbd;
  uint8_t *y_buffer = cpi->source->y_buffer;
  const int y_stride = cpi->source->y_stride;
  const int block_size = BLOCK_16X16;

  const int num_mi_w = mi_size_wide[block_size];
  const int num_mi_h = mi_size_high[block_size];
  const int num_cols = (mi_params->mi_cols + num_mi_w - 1) / num_mi_w;
  const int num_rows = (mi_params->mi_rows + num_mi_h - 1) / num_mi_h;
  double log_sum = 0.0;

  // Loop through each 16x16 block.
  for (int row = 0; row < num_rows; ++row) {
    for (int col = 0; col < num_cols; ++col) {
      double var = 0.0, num_of_var = 0.0;
      const int index = row * num_cols + col;

      // Loop through each 8x8 block.
      for (int mi_row = row * num_mi_h;
           mi_row < mi_params->mi_rows && mi_row < (row + 1) * num_mi_h;
           mi_row += 2) {
        for (int mi_col = col * num_mi_w;
             mi_col < mi_params->mi_cols && mi_col < (col + 1) * num_mi_w;
             mi_col += 2) {
          struct buf_2d buf;
          const int row_offset_y = mi_row << 2;
          const int col_offset_y = mi_col << 2;

          buf.buf = y_buffer + row_offset_y * y_stride + col_offset_y;
          buf.stride = y_stride;

          var += av1_get_perpixel_variance_facade(cpi, xd, &buf, BLOCK_8X8,
                                                  AOM_PLANE_Y);
          num_of_var += 1.0;
        }
      }
      var = var / num_of_var;

      // Curve fitting with an exponential model on all 16x16 blocks from the
      // midres dataset.
      var = 67.035434 * (1 - exp(-0.0021489 * var)) + 17.492222;

      // As per the above computation, var will be in the range of
      // [17.492222, 84.527656], assuming the data type is of infinite
      // precision. The following assert conservatively checks if var is in the
      // range of [17.0, 85.0] to avoid any issues due to the precision of the
      // relevant data type.
      assert(var > 17.0 && var < 85.0);
      cpi->ssim_rdmult_scaling_factors[index] = var;
      log_sum += log(var);
    }
  }

  // As log_sum holds the geometric mean, it will be in the range
  // [17.492222, 84.527656]. Hence, in the below loop, the value of
  // cpi->ssim_rdmult_scaling_factors[index] would be in the range
  // [0.2069, 4.8323].
  log_sum = exp(log_sum / (double)(num_rows * num_cols));

  for (int row = 0; row < num_rows; ++row) {
    for (int col = 0; col < num_cols; ++col) {
      const int index = row * num_cols + col;
      cpi->ssim_rdmult_scaling_factors[index] /= log_sum;
    }
  }
}